

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O0

dynamic_bit_vector * bsim::xorr(dynamic_bit_vector *a)

{
  uchar uVar1;
  int iVar2;
  dynamic_bit_vector *in_RSI;
  dynamic_bit_vector *in_RDI;
  int i;
  int numSet;
  int in_stack_ffffffffffffff5c;
  dynamic_bit_vector *in_stack_ffffffffffffff60;
  allocator *paVar3;
  allocator local_71;
  string local_70 [48];
  string *in_stack_ffffffffffffffc0;
  string local_38 [4];
  int in_stack_ffffffffffffffcc;
  dynamic_bit_vector *in_stack_ffffffffffffffd0;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    iVar2 = dynamic_bit_vector::bitLength(in_RSI);
    if (iVar2 <= local_18) break;
    uVar1 = dynamic_bit_vector::get(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (uVar1 == '\x01') {
      local_14 = local_14 + 1;
    }
    local_18 = local_18 + 1;
  }
  if (local_14 % 2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"0",(allocator *)&stack0xffffffffffffffc7);
    dynamic_bit_vector::dynamic_bit_vector
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  }
  else {
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"1",paVar3);
    dynamic_bit_vector::dynamic_bit_vector
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return in_RDI;
}

Assistant:

static inline dynamic_bit_vector
  xorr(const dynamic_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return dynamic_bit_vector(1, "0");
    }

    return dynamic_bit_vector(1, "1");
  }